

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_array_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,CTInfo flags)

{
  uint uVar1;
  uint uVar2;
  TValue *local_98;
  TValue *tv;
  CTSize ofs;
  CTSize esize;
  CTSize size;
  CType *dc;
  int32_t i;
  CTInfo flags_local;
  GCtab *t_local;
  uint8_t *dp_local;
  CType *d_local;
  CTState *cts_local;
  
  cts_local = (CTState *)d;
  do {
    cts_local = (CTState *)(cts->tab + (*(uint *)&cts_local->tab & 0xffff));
  } while (*(uint *)&cts_local->tab >> 0x1c == 8);
  uVar1 = d->size;
  uVar2 = *(CTSize *)((long)&cts_local->tab + 4);
  tv._4_4_ = 0;
  dc._0_4_ = 0;
  do {
    if ((uint)dc < t->asize) {
      local_98 = (TValue *)((t->array).ptr64 + (long)(int)(uint)dc * 8);
    }
    else {
      local_98 = lj_tab_getinth(t,(uint)dc);
    }
    if ((local_98 == (TValue *)0x0) || (local_98->u64 == 0xffffffffffffffff)) {
      if ((uint)dc != 0) {
        if (uVar1 != 0xffffffff) {
          if (tv._4_4_ == uVar2) {
            for (; tv._4_4_ < uVar1; tv._4_4_ = uVar2 + tv._4_4_) {
              memcpy(dp + tv._4_4_,dp,(ulong)uVar2);
            }
          }
          else {
            memset(dp + tv._4_4_,0,(ulong)(uVar1 - tv._4_4_));
          }
        }
        return;
      }
    }
    else {
      if (uVar1 <= tv._4_4_) {
        cconv_err_initov(cts,d);
      }
      lj_cconv_ct_tv(cts,(CType *)cts_local,dp + tv._4_4_,local_98,flags);
      tv._4_4_ = uVar2 + tv._4_4_;
    }
    dc._0_4_ = (uint)dc + 1;
  } while( true );
}

Assistant:

static void cconv_array_tab(CTState *cts, CType *d,
			    uint8_t *dp, GCtab *t, CTInfo flags)
{
  int32_t i;
  CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
  CTSize size = d->size, esize = dc->size, ofs = 0;
  for (i = 0; ; i++) {
    TValue *tv = (TValue *)lj_tab_getint(t, i);
    if (!tv || tvisnil(tv)) {
      if (i == 0) continue;  /* Try again for 1-based tables. */
      break;  /* Stop at first nil. */
    }
    if (ofs >= size)
      cconv_err_initov(cts, d);
    lj_cconv_ct_tv(cts, dc, dp + ofs, tv, flags);
    ofs += esize;
  }
  if (size != CTSIZE_INVALID) {  /* Only fill up arrays with known size. */
    if (ofs == esize) {  /* Replicate a single element. */
      for (; ofs < size; ofs += esize) memcpy(dp + ofs, dp, esize);
    } else {  /* Otherwise fill the remainder with zero. */
      memset(dp + ofs, 0, size - ofs);
    }
  }
}